

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResponseBase.h
# Opt level: O0

string * __thiscall
ResponseBase::attribute<unsigned_long>(ResponseBase *this,char *name,unsigned_long *value)

{
  ostream *poVar1;
  ulong *in_RCX;
  char *in_RDX;
  string *in_RDI;
  ostringstream stream;
  ostringstream local_198 [376];
  ulong *local_20;
  char *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"[");
  poVar1 = std::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_20);
  std::operator<<(poVar1,"]");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return in_RDI;
}

Assistant:

std::string attribute(const char* name, const T& value) const {
        std::ostringstream stream;
        stream << "[" << name << ": " << value << "]";
        return stream.str();
    }